

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitGlobalGet(BinaryInstWriter *this,GlobalGet *curr)

{
  bool bVar1;
  uint32_t uVar2;
  pointer ppVar3;
  BufferWithRandomAccess *pBVar4;
  U32LEB local_60;
  uint local_5c;
  size_t sStack_58;
  Index i;
  size_t numValues;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false> local_48;
  GlobalGet *local_40;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false> local_38;
  iterator it;
  Index index;
  GlobalGet *curr_local;
  BinaryInstWriter *this_local;
  
  it.super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>)
       (curr->name).super_IString.str._M_len;
  uVar2 = WasmBinaryWriter::getGlobalIndex(this->parent,(Name)(curr->name).super_IString.str);
  local_40 = curr;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
       ::find(&this->extractedGets,(key_type *)&local_40);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
       ::end(&this->extractedGets);
  bVar1 = std::__detail::operator!=(&local_38,&local_48);
  if (bVar1) {
    pBVar4 = BufferWithRandomAccess::operator<<(this->o,'#');
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_false>
                         *)&local_38);
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)((long)&numValues + 4),uVar2 + ppVar3->second);
    BufferWithRandomAccess::operator<<(pBVar4,numValues._4_4_);
  }
  else {
    sStack_58 = wasm::Type::size(&(curr->super_SpecificExpression<(wasm::Expression::Id)10>).
                                  super_Expression.type);
    for (local_5c = 0; local_5c < sStack_58; local_5c = local_5c + 1) {
      pBVar4 = BufferWithRandomAccess::operator<<(this->o,'#');
      LEB<unsigned_int,_unsigned_char>::LEB(&local_60,uVar2 + local_5c);
      BufferWithRandomAccess::operator<<(pBVar4,local_60);
    }
  }
  return;
}

Assistant:

void BinaryInstWriter::visitGlobalGet(GlobalGet* curr) {
  Index index = parent.getGlobalIndex(curr->name);
  if (auto it = extractedGets.find(curr); it != extractedGets.end()) {
    // We have a tuple of globals to get, but we will only end up using one of
    // them, so we can just emit that one.
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + it->second);
    return;
  }
  // Emit a global.get for each element if this is a tuple global
  size_t numValues = curr->type.size();
  for (Index i = 0; i < numValues; ++i) {
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + i);
  }
}